

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

bool __thiscall
ON_WeightedAverageHash::Read(ON_WeightedAverageHash *this,ON_BinaryArchive *binary_archive)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  ON_3dPoint *p;
  
  bVar2 = ON_BinaryArchive::ReadPoint(binary_archive,this->m_sum);
  if (bVar2) {
    p = this->m_sum;
    uVar1 = 0;
    do {
      uVar3 = uVar1;
      p = p + 1;
      if (uVar3 == 4) break;
      bVar2 = ON_BinaryArchive::ReadPoint(binary_archive,p);
      uVar1 = uVar3 + 1;
    } while (bVar2);
    bVar2 = 3 < uVar3;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ON_WeightedAverageHash::Read(ON_BinaryArchive& binary_archive)
{
  for (int i = 0; i < dim; i++)
  {
    if (!binary_archive.ReadPoint(m_sum[i]))
      return false;
  }
  return true;
}